

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O2

void __thiscall
pbrt::InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::reserve
          (InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> *this,size_t n)

{
  anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5 *p;
  ulong uVar1;
  int *piVar2;
  anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
  *paVar3;
  int i;
  ulong uVar4;
  
  if (this->ptr == (int *)0x0) {
    uVar1 = 4;
  }
  else {
    uVar1 = this->nAlloc;
  }
  if (uVar1 < n) {
    piVar2 = pstd::pmr::polymorphic_allocator<int>::allocate_object<int>(&this->alloc,n);
    p = (anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
         *)this->ptr;
    uVar1 = this->nStored;
    paVar3 = &this->field_2;
    if (p != (anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
              *)0x0) {
      paVar3 = p;
    }
    for (uVar4 = 0; uVar4 < uVar1; uVar4 = uVar4 + 1) {
      piVar2[uVar4] = paVar3->fixed[uVar4];
    }
    pstd::pmr::polymorphic_allocator<int>::deallocate_object<int>
              (&this->alloc,p->fixed,this->nAlloc);
    this->nAlloc = n;
    this->ptr = piVar2;
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (capacity() >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }